

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall cmState::~cmState(cmState *this)

{
  cmCacheManager *this_00;
  cmState *this_local;
  
  this_00 = this->CacheManager;
  if (this_00 != (cmCacheManager *)0x0) {
    cmCacheManager::~cmCacheManager(this_00);
    operator_delete(this_00,0x40);
  }
  cmDeleteAll<std::map<std::__cxx11::string,cmCommand*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>>
            (&this->BuiltinCommands);
  cmDeleteAll<std::map<std::__cxx11::string,cmCommand*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCommand*>>>>
            (&this->ScriptedCommands);
  std::__cxx11::string::~string((string *)&this->BinaryDirectory);
  std::__cxx11::string::~string((string *)&this->SourceDirectory);
  cmLinkedTree<cmDefinitions>::~cmLinkedTree(&this->VarTree);
  cmLinkedTree<cmStateDetail::SnapshotDataType>::~cmLinkedTree(&this->SnapshotData);
  cmLinkedTree<cmStateDetail::PolicyStackEntry>::~cmLinkedTree(&this->PolicyStack);
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~cmLinkedTree(&this->ExecutionListFiles);
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::~cmLinkedTree
            (&this->BuildsystemDirectory);
  cmPropertyMap::~cmPropertyMap(&this->GlobalProperties);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
  ::~map(&this->ScriptedCommands);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCommand_*>_>_>
  ::~map(&this->BuiltinCommands);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->EnabledLanguages);
  std::
  map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
  ::~map(&this->PropertyDefinitions);
  return;
}

Assistant:

cmState::~cmState()
{
  delete this->CacheManager;
  cmDeleteAll(this->BuiltinCommands);
  cmDeleteAll(this->ScriptedCommands);
}